

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O3

void InitializeRandomSeeds(uint64 *seed0,uint64 *seed1,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  errno_t eVar3;
  undefined4 *puVar4;
  uint64 uVar5;
  undefined8 local_28;
  LARGE_INTEGER s0;
  LARGE_INTEGER s1;
  
  if (DAT_015bf3fc == 0 || (long)DAT_015bf3f8 == 0) {
    eVar3 = rand_s((uint *)&local_28);
    if ((((eVar3 == 0) && (eVar3 = rand_s((uint *)((long)&local_28 + 4)), eVar3 == 0)) &&
        (eVar3 = rand_s((uint *)&s0.QuadPart), eVar3 == 0)) &&
       (eVar3 = rand_s((uint *)&s0.field_0.HighPart), eVar3 == 0)) {
      *seed0 = local_28;
      *seed1 = (uint64)s0;
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                       ,0x4fb,"(false)",
                       "Unable to initialize PRNG seeds with rand_s. Revert to using entropy.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  else {
    uVar5 = (uint64)DAT_015bf3fc;
    *seed0 = (long)DAT_015bf3f8;
    *seed1 = uVar5;
  }
  return;
}

Assistant:

void InitializeRandomSeeds(uint64 *seed0, uint64 *seed1, ScriptContext *scriptContext)
        {
#if DBG
            if (CONFIG_FLAG(PRNGSeed0) && CONFIG_FLAG(PRNGSeed1))
            {
                *seed0 = CONFIG_FLAG(PRNGSeed0);
                *seed1 = CONFIG_FLAG(PRNGSeed1);
            }
            else
#endif
            {
                LARGE_INTEGER s0;
                LARGE_INTEGER s1;

                if (!rand_s(reinterpret_cast<unsigned int*>(&s0.LowPart)) &&
                    !rand_s(reinterpret_cast<unsigned int*>(&s0.HighPart)) &&
                    !rand_s(reinterpret_cast<unsigned int*>(&s1.LowPart)) &&
                    !rand_s(reinterpret_cast<unsigned int*>(&s1.HighPart)))
                {
                    *seed0 = s0.QuadPart;
                    *seed1 = s1.QuadPart;
                }
                else
                {
                    AssertMsg(false, "Unable to initialize PRNG seeds with rand_s. Revert to using entropy.");
#ifdef ENABLE_CUSTOM_ENTROPY
                    ThreadContext *threadContext = scriptContext->GetThreadContext();

                    threadContext->GetEntropy().AddThreadCycleTime();
                    threadContext->GetEntropy().AddIoCounters();
                    *seed0 = threadContext->GetEntropy().GetRand();

                    threadContext->GetEntropy().AddThreadCycleTime();
                    threadContext->GetEntropy().AddIoCounters();
                    *seed1 = threadContext->GetEntropy().GetRand();
#endif
                }
            }
        }